

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.h
# Opt level: O0

double __thiscall
imrt::Plan::get_delta_eval(Plan *this,Station *s,int i,int j,double intensity,int n_voxels)

{
  int iVar1;
  pair<int,_int> pVar2;
  Station *in_RSI;
  long in_RDI;
  double dVar3;
  vector<double,_std::allocator<double>_> *in_stack_00000148;
  vector<double,_std::allocator<double>_> *in_stack_00000150;
  vector<double,_std::allocator<double>_> *in_stack_00000158;
  double in_stack_00000160;
  int in_stack_00000168;
  int in_stack_0000016c;
  EvaluationFunction *in_stack_00000170;
  int in_stack_00000180;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  key_type *__k;
  
  __k = *(key_type **)(in_RDI + 0x78);
  iVar1 = Station::getAngle(in_RSI);
  pVar2 = std::make_pair<int&,int&>
                    ((int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (int *)0x173dc1);
  std::
  map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::at((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
        *)CONCAT44(pVar2.first,iVar1),__k);
  dVar3 = EvaluationFunction::get_delta_eval
                    (in_stack_00000170,in_stack_0000016c,in_stack_00000168,in_stack_00000160,
                     in_stack_00000158,in_stack_00000150,in_stack_00000148,in_stack_00000180);
  return dVar3;
}

Assistant:

double get_delta_eval (Station& s, int i, int j, double intensity, int n_voxels=999999){
    return ev.get_delta_eval(s.getAngle(),
    s.pos2beam.at(make_pair(i,j)), intensity, w, Zmin, Zmax, n_voxels);
  }